

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O2

void __thiscall QGridLayout::setGeometry(QGridLayout *this,QRect *rect)

{
  QGridLayoutPrivate *this_00;
  bool bVar1;
  int hSpacing;
  int vSpacing;
  long in_FS_OFFSET;
  QRect r;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGridLayoutPrivate **)&(this->super_QLayout).field_0x8;
  if ((this_00->field_0x194 & 4) == 0) {
    local_48 = (QRect)(**(code **)(*(long *)&this->super_QLayout + 0x78))(this);
    bVar1 = ::operator!=(rect,&local_48);
    if (!bVar1) goto LAB_002e0cc4;
  }
  if ((this->super_QLayout).super_QLayoutItem.align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
      super_QFlagsStorage<Qt::AlignmentFlag>.i == 0) {
    r = *rect;
  }
  else {
    r = QLayout::alignmentRect(&this->super_QLayout,rect);
  }
  hSpacing = horizontalSpacing(this);
  vSpacing = verticalSpacing(this);
  QGridLayoutPrivate::distribute(this_00,r,hSpacing,vSpacing);
  QLayout::setGeometry(&this->super_QLayout,rect);
LAB_002e0cc4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGridLayout::setGeometry(const QRect &rect)
{
    Q_D(QGridLayout);
    if (d->isDirty() || rect != geometry()) {
        QRect cr = alignment() ? alignmentRect(rect) : rect;
        d->distribute(cr, horizontalSpacing(), verticalSpacing());
        QLayout::setGeometry(rect);
    }
}